

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

void Am_Start_Animator(Am_Object *interp,Am_Value *value1,Am_Value *value2)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_50;
  undefined1 local_48 [8];
  Am_Object_Method method;
  Am_Object local_28;
  Am_Value *local_20;
  Am_Value *value2_local;
  Am_Value *value1_local;
  Am_Object *interp_local;
  
  local_20 = value2;
  value2_local = value1;
  value1_local = (Am_Value *)interp;
  pAVar2 = Am_Object::Get(interp,0xf7,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  if (!bVar1) {
    Am_Object::Set(interp,0xf7,true,0);
    bVar1 = Am_Value::operator!=(value2_local,&Am_No_Value);
    if (bVar1) {
      Am_Object::Set(interp,0x181,value2_local,0);
      Am_Object::Set(interp,0x169,value2_local,0);
      Am_Object::Am_Object(&local_28,interp);
      Am_Set_Animated_Slots(&local_28);
      Am_Object::~Am_Object(&local_28);
    }
    bVar1 = Am_Value::operator!=(local_20,&Am_No_Value);
    if (bVar1) {
      Am_Object::Set(interp,0x182,local_20,0);
    }
    pAVar2 = Am_Object::Get(interp,199,0);
    Am_Object_Method::Am_Object_Method((Am_Object_Method *)local_48,pAVar2);
    bVar1 = Am_Object_Method::Valid((Am_Object_Method *)local_48);
    if (bVar1) {
      Am_Object::Am_Object(&local_50,interp);
      (*(code *)method.from_wrapper)(&local_50);
      Am_Object::~Am_Object(&local_50);
    }
  }
  return;
}

Assistant:

void
Am_Start_Animator(Am_Object interp, const Am_Value &value1,
                  const Am_Value &value2)
{
  if (static_cast<bool>(interp.Get(Am_RUNNING)) == true) {
    return;
  }

  interp.Set(Am_RUNNING, true);

  if (value1 != Am_No_Value) {
    interp.Set(Am_VALUE_1, value1);
    interp.Set(Am_VALUE, value1);
    Am_Set_Animated_Slots(interp); // reset the slots to value1
  }

  if (value2 != Am_No_Value) {
    interp.Set(Am_VALUE_2, value2);
  }

  Am_Object_Method method = interp.Get(Am_START_DO_METHOD);
  if (method.Valid()) {
    method.Call(interp);
  }

  return;
}